

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mttr(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx,int rd,int rt,int u,int sel,
             int h)

{
  uint uVar1;
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i32 pTVar2;
  TCGv_i32 arg4;
  TCGv_i32 helper_tmp_13;
  TCGv_i32 fs_tmp;
  TCGv_i32 fp0_1;
  TCGv_i32 fp0;
  TCGv_i32 helper_tmp_12;
  TCGv_i32 helper_tmp_11;
  TCGv_i32 helper_tmp_10;
  TCGv_i32 helper_tmp_9;
  TCGv_i32 helper_tmp_8;
  TCGv_i32 helper_tmp_7;
  TCGv_i32 helper_tmp_6;
  TCGv_i32 helper_tmp_5;
  TCGv_i32 helper_tmp_4;
  TCGv_i32 helper_tmp_3;
  TCGv_i32 helper_tmp_2;
  TCGv_i32 helper_tmp_1;
  TCGv_i32 helper_tmp;
  TCGv_i64 t0;
  int other_tc;
  TCGContext_conflict6 *tcg_ctx;
  int sel_local;
  int u_local;
  int rt_local;
  int rd_local;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = env->CP0_VPEControl;
  t = tcg_temp_local_new_i64(tcg_ctx_00);
  gen_load_gpr(tcg_ctx_00,t,rt);
  if ((((env->CP0_VPEConf0 & 2U) != 0) ||
      ((env->tcs[(int)(uVar1 & 0xff)].CP0_TCBind & 0xfU) == ((env->active_tc).CP0_TCBind & 0xfU)))
     && ((env->CP0_VPEControl & 0xffU) <= (env->mvp->CP0_MVPConf0 & 0xffU))) {
    if (u == 0) {
      switch(rd) {
      case 1:
        if (sel == 1) {
          gen_helper_mttc0_vpecontrol(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        }
        else {
          if (sel != 2) goto switchD_00d12627_default;
          gen_helper_mttc0_vpeconf0(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        }
        break;
      case 2:
        switch(sel) {
        case 1:
          gen_helper_mttc0_tcstatus(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
          break;
        case 2:
          gen_helper_mttc0_tcbind(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
          break;
        case 3:
          gen_helper_mttc0_tcrestart(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
          break;
        case 4:
          gen_helper_mttc0_tchalt(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
          break;
        case 5:
          gen_helper_mttc0_tccontext(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
          break;
        case 6:
          gen_helper_mttc0_tcschedule(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
          break;
        case 7:
          gen_helper_mttc0_tcschefback(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
          break;
        default:
          gen_mtc0(ctx,t,rd,sel);
        }
        break;
      default:
        gen_mtc0(ctx,t,rd,sel);
        break;
      case 10:
        if (sel == 0) {
          gen_helper_mttc0_entryhi(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        }
        else {
          gen_mtc0(ctx,t,rd,sel);
        }
        break;
      case 0xc:
        if (sel == 0) {
          gen_helper_mttc0_status(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        }
        else {
          gen_mtc0(ctx,t,rd,sel);
        }
        break;
      case 0xd:
        if (sel != 0) goto switchD_00d12627_default;
        gen_helper_mttc0_cause(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        break;
      case 0xf:
        if (sel != 1) goto switchD_00d12627_default;
        gen_helper_mttc0_ebase(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        break;
      case 0x17:
        if (sel == 0) {
          gen_helper_mttc0_debug(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        }
        else {
          gen_mtc0(ctx,t,rd,sel);
        }
      }
    }
    else {
      switch(sel) {
      case 0:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,rd);
        gen_helper_mttgpr(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        break;
      case 1:
        switch(rd) {
        case 0:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,0);
          gen_helper_mttlo(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 1:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,0);
          gen_helper_mtthi(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 2:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,0);
          gen_helper_mttacx(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        default:
          goto switchD_00d12627_default;
        case 4:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,1);
          gen_helper_mttlo(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 5:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,1);
          gen_helper_mtthi(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 6:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,1);
          gen_helper_mttacx(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 8:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,2);
          gen_helper_mttlo(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 9:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,2);
          gen_helper_mtthi(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 10:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,2);
          gen_helper_mttacx(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 0xc:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,3);
          gen_helper_mttlo(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 0xd:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,3);
          gen_helper_mtthi(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 0xe:
          pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,3);
          gen_helper_mttacx(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
          break;
        case 0x10:
          gen_helper_mttdsp(tcg_ctx_00,tcg_ctx_00->cpu_env,t);
        }
        break;
      case 2:
        if (h == 0) {
          pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
          tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t);
          gen_store_fpr32(ctx,pTVar2,rd);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        }
        else {
          pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
          tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t);
          gen_store_fpr32h(ctx,pTVar2,rd);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        }
        break;
      case 3:
        pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,rd);
        arg4 = tcg_const_i32_mips64el(tcg_ctx_00,rt);
        gen_helper_ctc1(tcg_ctx_00,tcg_ctx_00->cpu_env,t,pTVar2,arg4);
        tcg_temp_free_i32(tcg_ctx_00,arg4);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        (ctx->base).is_jmp = DISAS_TARGET_0;
        break;
      case 4:
      case 5:
      default:
switchD_00d12627_default:
        tcg_temp_free_i64(tcg_ctx_00,t);
        generate_exception_end(ctx,0x14);
        return;
      }
    }
  }
  tcg_temp_free_i64(tcg_ctx_00,t);
  return;
}

Assistant:

static void gen_mttr(CPUMIPSState *env, DisasContext *ctx, int rd, int rt,
                     int u, int sel, int h)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    TCGv t0 = tcg_temp_local_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rt);
    if ((env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) == 0 &&
        ((env->tcs[other_tc].CP0_TCBind & (0xf << CP0TCBd_CurVPE)) !=
         (env->active_tc.CP0_TCBind & (0xf << CP0TCBd_CurVPE)))) {
        /* NOP */
        ;
    } else if ((env->CP0_VPEControl & (0xff << CP0VPECo_TargTC)) >
             (env->mvp->CP0_MVPConf0 & (0xff << CP0MVPC0_PTC))) {
        /* NOP */
        ;
    } else if (u == 0) {
        switch (rd) {
        case 1:
            switch (sel) {
            case 1:
                gen_helper_mttc0_vpecontrol(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 2:
                gen_helper_mttc0_vpeconf0(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 2:
            switch (sel) {
            case 1:
                gen_helper_mttc0_tcstatus(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 2:
                gen_helper_mttc0_tcbind(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 3:
                gen_helper_mttc0_tcrestart(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 4:
                gen_helper_mttc0_tchalt(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 5:
                gen_helper_mttc0_tccontext(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 6:
                gen_helper_mttc0_tcschedule(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            case 7:
                gen_helper_mttc0_tcschefback(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 10:
            switch (sel) {
            case 0:
                gen_helper_mttc0_entryhi(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 12:
            switch (sel) {
            case 0:
                gen_helper_mttc0_status(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        case 13:
            switch (sel) {
            case 0:
                gen_helper_mttc0_cause(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 15:
            switch (sel) {
            case 1:
                gen_helper_mttc0_ebase(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
                break;
            }
            break;
        case 23:
            switch (sel) {
            case 0:
                gen_helper_mttc0_debug(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                gen_mtc0(ctx, t0, rd, sel);
                break;
            }
            break;
        default:
            gen_mtc0(ctx, t0, rd, sel);
        }
    } else {
        switch (sel) {
        /* GPR registers. */
        case 0:
            gen_helper_0e1i(mttgpr, t0, rd);
            break;
        /* Auxiliary CPU registers */
        case 1:
            switch (rd) {
            case 0:
                gen_helper_0e1i(mttlo, t0, 0);
                break;
            case 1:
                gen_helper_0e1i(mtthi, t0, 0);
                break;
            case 2:
                gen_helper_0e1i(mttacx, t0, 0);
                break;
            case 4:
                gen_helper_0e1i(mttlo, t0, 1);
                break;
            case 5:
                gen_helper_0e1i(mtthi, t0, 1);
                break;
            case 6:
                gen_helper_0e1i(mttacx, t0, 1);
                break;
            case 8:
                gen_helper_0e1i(mttlo, t0, 2);
                break;
            case 9:
                gen_helper_0e1i(mtthi, t0, 2);
                break;
            case 10:
                gen_helper_0e1i(mttacx, t0, 2);
                break;
            case 12:
                gen_helper_0e1i(mttlo, t0, 3);
                break;
            case 13:
                gen_helper_0e1i(mtthi, t0, 3);
                break;
            case 14:
                gen_helper_0e1i(mttacx, t0, 3);
                break;
            case 16:
                gen_helper_mttdsp(tcg_ctx, tcg_ctx->cpu_env, t0);
                break;
            default:
                goto die;
            }
            break;
        /* Floating point (COP1). */
        case 2:
            /* XXX: For now we support only a single FPU context. */
            if (h == 0) {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
                gen_store_fpr32(ctx, fp0, rd);
                tcg_temp_free_i32(tcg_ctx, fp0);
            } else {
                TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
                gen_store_fpr32h(ctx, fp0, rd);
                tcg_temp_free_i32(tcg_ctx, fp0);
            }
            break;
        case 3:
            /* XXX: For now we support only a single FPU context. */
            {
                TCGv_i32 fs_tmp = tcg_const_i32(tcg_ctx, rd);

                gen_helper_0e2i(ctc1, t0, fs_tmp, rt);
                tcg_temp_free_i32(tcg_ctx, fs_tmp);
            }
            /* Stop translation as we may have changed hflags */
            ctx->base.is_jmp = DISAS_STOP;
            break;
        /* COP2: Not implemented. */
        case 4:
        case 5:
            /* fall through */
        default:
            goto die;
        }
    }
    tcg_temp_free(tcg_ctx, t0);
    return;

die:
    tcg_temp_free(tcg_ctx, t0);
    LOG_DISAS("mttr (reg %d u %d sel %d h %d)\n", rd, u, sel, h);
    generate_exception_end(ctx, EXCP_RI);
}